

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPrsBuild.c
# Opt level: O2

void Psr_ManCleanMap(Psr_Ntk_t *pNtk,Vec_Int_t *vMap)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = 0;
  while ((iVar3 < (pNtk->vInputs).nSize && (iVar1 = Vec_IntEntry(&pNtk->vInputs,iVar3), iVar1 != 0))
        ) {
    Vec_IntWriteEntry(vMap,iVar1,-1);
    iVar3 = iVar3 + 1;
  }
  for (iVar3 = 0; iVar3 < (pNtk->vObjs).nSize; iVar3 = iVar3 + 1) {
    Psr_BoxSignals(pNtk,iVar3);
    for (iVar1 = 1; iVar1 < Psr_BoxSignals::V.nSize; iVar1 = iVar1 + 2) {
      Vec_IntEntry(&Psr_BoxSignals::V,iVar1 + -1);
      iVar2 = Vec_IntEntry(&Psr_BoxSignals::V,iVar1);
      iVar2 = Psr_NtkSigName(pNtk,iVar2);
      Vec_IntWriteEntry(vMap,iVar2,-1);
    }
  }
  iVar3 = 0;
  while( true ) {
    if ((pNtk->vOutputs).nSize <= iVar3) {
      return;
    }
    iVar1 = Vec_IntEntry(&pNtk->vOutputs,iVar3);
    if (iVar1 == 0) break;
    Vec_IntWriteEntry(vMap,iVar1,-1);
    iVar3 = iVar3 + 1;
  }
  return;
}

Assistant:

void Psr_ManCleanMap( Psr_Ntk_t * pNtk, Vec_Int_t * vMap )
{
    Vec_Int_t * vSigs; 
    int i, k, NameId, Sig;
    Psr_NtkForEachPi( pNtk, NameId, i )
        Vec_IntWriteEntry( vMap, NameId, -1 );
    Psr_NtkForEachBox( pNtk, vSigs, i )
        Vec_IntForEachEntryDouble( vSigs, NameId, Sig, k )
            Vec_IntWriteEntry( vMap, Psr_NtkSigName(pNtk, Sig), -1 );
    Psr_NtkForEachPo( pNtk, NameId, i )
        Vec_IntWriteEntry( vMap, NameId, -1 );
}